

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_32(QPDF *pdf,char *arg2)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator<char> local_81;
  string local_80 [48];
  QPDFWriter local_50 [8];
  QPDFWriter w;
  uint local_3c;
  bool newline;
  bool linearized;
  int i;
  char *filenames [4];
  char *arg2_local;
  QPDF *pdf_local;
  
  filenames[3] = arg2;
  filenames[0] = "b.pdf";
  filenames[1] = "c.pdf";
  filenames[2] = "d.pdf";
  for (local_3c = 0; (int)local_3c < 4; local_3c = local_3c + 1) {
    uVar1 = (local_3c & 2) >> 1;
    QPDFWriter::QPDFWriter(local_50,pdf,filenames[(long)(int)local_3c + -1]);
    QPDFWriter::setStaticID(SUB81(local_50,0));
    poVar2 = std::operator<<((ostream *)&std::cout,"file: ");
    poVar2 = std::operator<<(poVar2,filenames[(long)(int)local_3c + -1]);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"linearized: ");
    pcVar3 = "no";
    if ((local_3c & 1) != 0) {
      pcVar3 = "yes";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"newline: ");
    pcVar3 = "no";
    if (uVar1 != 0) {
      pcVar3 = "yes";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    QPDFWriter::setLinearization(SUB81(local_50,0));
    if ((local_3c & 1) != 0) {
      QPDFWriter::setCompressStreams(SUB81(local_50,0));
    }
    pcVar3 = "%% Comment\n% No newline";
    if ((char)uVar1 != '\0') {
      pcVar3 = "%% Comment with newline\n";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,pcVar3,&local_81);
    QPDFWriter::setExtraHeaderText((string *)local_50);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_50);
  }
  return;
}

Assistant:

static void
test_32(QPDF& pdf, char const* arg2)
{
    // Extra header text
    char const* filenames[] = {"a.pdf", "b.pdf", "c.pdf", "d.pdf"};
    for (int i = 0; i < 4; ++i) {
        bool linearized = ((i & 1) != 0);
        bool newline = ((i & 2) != 0);
        QPDFWriter w(pdf, filenames[i]);
        w.setStaticID(true);
        std::cout << "file: " << filenames[i] << std::endl
                  << "linearized: " << (linearized ? "yes" : "no") << std::endl
                  << "newline: " << (newline ? "yes" : "no") << std::endl;
        w.setLinearization(linearized);
        if (linearized) {
            w.setCompressStreams(false); // avoid dependency on zlib's output
        }
        w.setExtraHeaderText(newline ? "%% Comment with newline\n" : "%% Comment\n% No newline");
        w.write();
    }
}